

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmevent.c
# Opt level: O0

ptrdiff_t lj_vmevent_prepare(lua_State *L,VMEvent ev)

{
  uint uVar1;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *paVar2;
  uint key;
  GCstr *key_00;
  cTValue *pcVar3;
  uint in_ESI;
  size_t in_RDI;
  int hash;
  cTValue *tv;
  GCstr *s;
  global_State *g;
  undefined4 in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  
  uVar1 = *(uint *)(in_RDI + 8);
  key_00 = lj_str_new((lua_State *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      in_stack_ffffffffffffffb0,in_RDI);
  pcVar3 = lj_tab_getstr((GCtab *)(ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x98),key_00);
  if ((pcVar3->field_2).it == 0xfffffff4) {
    key = in_ESI & 0xfffffff8;
    if (key < *(uint *)((ulong)(pcVar3->u32).lo + 0x18)) {
      pcVar3 = (cTValue *)((ulong)*(uint *)((ulong)(pcVar3->u32).lo + 8) + (long)(int)key * 8);
    }
    else {
      pcVar3 = lj_tab_getinth((GCtab *)(ulong)(pcVar3->u32).lo,key);
    }
    if ((pcVar3 != (cTValue *)0x0) && ((pcVar3->field_2).it == 0xfffffff7)) {
      if ((long)((ulong)*(uint *)(in_RDI + 0x20) - *(long *)(in_RDI + 0x18)) < 0xa1) {
        lj_state_growstack((lua_State *)CONCAT44(key,in_stack_ffffffffffffff80),
                           (MSize)((ulong)pcVar3 >> 0x20));
      }
      paVar2 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 **)
                (in_RDI + 0x18);
      *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 **)(in_RDI + 0x18) =
           paVar2 + 2;
      *paVar2 = (pcVar3->field_2).field_0;
      paVar2[1].i = -9;
      return *(long *)(in_RDI + 0x18) - (ulong)*(uint *)(in_RDI + 0x24);
    }
  }
  *(byte *)((ulong)uVar1 + 0x93) =
       *(byte *)((ulong)uVar1 + 0x93) & ((byte)(1 << ((byte)in_ESI & 7)) ^ 0xff);
  return 0;
}

Assistant:

ptrdiff_t lj_vmevent_prepare(lua_State *L, VMEvent ev)
{
  global_State *g = G(L);
  GCstr *s = lj_str_newlit(L, LJ_VMEVENTS_REGKEY);
  cTValue *tv = lj_tab_getstr(tabV(registry(L)), s);
  if (tvistab(tv)) {
    int hash = VMEVENT_HASH(ev);
    tv = lj_tab_getint(tabV(tv), hash);
    if (tv && tvisfunc(tv)) {
      lj_state_checkstack(L, LUA_MINSTACK);
      setfuncV(L, L->top++, funcV(tv));
      return savestack(L, L->top);
    }
  }
  g->vmevmask &= ~VMEVENT_MASK(ev);  /* No handler: cache this fact. */
  return 0;
}